

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool op_smlaxxx(DisasContext_conflict1 *s,arg_rrrr *a,int add_long,_Bool nt,_Bool mt)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar1;
  TCGTemp *pTVar2;
  TCGTemp *pTVar3;
  uintptr_t o_1;
  TCGv_i32 pTVar4;
  int iVar5;
  uintptr_t o_2;
  TCGv_i32 pTVar6;
  TCGv_i32 var;
  uintptr_t o;
  TCGContext_conflict1 *tcg_ctx;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    if ((short)s->features < 0) goto LAB_0065dd20;
  }
  else if ((s->features >> 0x22 & 1) != 0) {
LAB_0065dd20:
    iVar5 = a->rn;
    pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    pTVar6 = (TCGv_i32)((long)pTVar2 - (long)s_00);
    load_reg_var(s,pTVar6,iVar5);
    iVar5 = a->rm;
    pTVar1 = s->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
    pTVar4 = (TCGv_i32)((long)pTVar3 - (long)pTVar1);
    load_reg_var(s,pTVar4,iVar5);
    if (nt) {
      tcg_gen_sari_i32_aarch64(s_00,pTVar6,pTVar6,0x10);
    }
    else {
      tcg_gen_ext16s_i32_aarch64(s_00,pTVar6,pTVar6);
    }
    if (mt) {
      tcg_gen_sari_i32_aarch64(s_00,pTVar4,pTVar4,0x10);
    }
    else {
      tcg_gen_ext16s_i32_aarch64(s_00,pTVar4,pTVar4);
    }
    pTVar3 = (TCGTemp *)((long)s_00 + (long)pTVar6);
    tcg_gen_op3_aarch64(s_00,INDEX_op_mul_i32,(TCGArg)pTVar2,(TCGArg)pTVar2,
                        (TCGArg)(pTVar4 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar4 + (long)s_00));
    if (add_long == 2) {
      iVar5 = a->ra;
      pTVar1 = s->uc->tcg_ctx;
      pTVar2 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
      var = (TCGv_i32)((long)pTVar2 - (long)pTVar1);
      load_reg_var(s,var,iVar5);
      iVar5 = a->rd;
      pTVar1 = s->uc->tcg_ctx;
      pTVar2 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
      pTVar4 = (TCGv_i32)((long)pTVar2 - (long)pTVar1);
      load_reg_var(s,pTVar4,iVar5);
      pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      tcg_gen_sari_i32_aarch64(s_00,(TCGv_i32)((long)pTVar2 - (long)s_00),pTVar6,0x1f);
      tcg_gen_add2_i32_aarch64
                (s_00,var,pTVar4,var,pTVar4,pTVar6,(TCGv_i32)((long)pTVar2 - (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,pTVar3);
      tcg_temp_free_internal_aarch64(s_00,pTVar2);
      store_reg(s,a->ra,var);
      iVar5 = a->rd;
    }
    else {
      pTVar4 = pTVar6;
      if (add_long == 1) {
        iVar5 = a->ra;
        pTVar1 = s->uc->tcg_ctx;
        pTVar2 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
        pTVar6 = (TCGv_i32)((long)pTVar2 - (long)pTVar1);
        load_reg_var(s,pTVar6,iVar5);
        local_48 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
        pTVar2 = (TCGTemp *)(pTVar6 + (long)s_00);
        local_40 = pTVar3;
        local_38 = pTVar2;
        tcg_gen_callN_aarch64(s_00,helper_add_setq_aarch64,pTVar3,3,&local_48);
        tcg_temp_free_internal_aarch64(s_00,pTVar2);
        iVar5 = a->rd;
      }
      else {
        iVar5 = a->rd;
      }
    }
    store_reg(s,iVar5,pTVar4);
    return true;
  }
  return false;
}

Assistant:

static bool op_smlaxxx(DisasContext *s, arg_rrrr *a,
                       int add_long, bool nt, bool mt)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1, tl, th;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_5TE) {
        return false;
    }

    t0 = load_reg(s, a->rn);
    t1 = load_reg(s, a->rm);
    gen_mulxy(tcg_ctx, t0, t1, nt, mt);
    tcg_temp_free_i32(tcg_ctx, t1);

    switch (add_long) {
    case 0:
        store_reg(s, a->rd, t0);
        break;
    case 1:
        t1 = load_reg(s, a->ra);
        gen_helper_add_setq(tcg_ctx, t0, tcg_ctx->cpu_env, t0, t1);
        tcg_temp_free_i32(tcg_ctx, t1);
        store_reg(s, a->rd, t0);
        break;
    case 2:
        tl = load_reg(s, a->ra);
        th = load_reg(s, a->rd);
        /* Sign-extend the 32-bit product to 64 bits.  */
        t1 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_sari_i32(tcg_ctx, t1, t0, 31);
        tcg_gen_add2_i32(tcg_ctx, tl, th, tl, th, t0, t1);
        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
        store_reg(s, a->ra, tl);
        store_reg(s, a->rd, th);
        break;
    default:
        g_assert_not_reached();
        break;
    }
    return true;
}